

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_symbolic_physical.cpp
# Opt level: O1

void symbolic_to_physical(block_size_descriptor *bsd,symbolic_compressed_block *scb,uint8_t *pcb)

{
  uint8_t uVar1;
  byte bVar2;
  ushort uVar3;
  uint16_t uVar4;
  quant_method quant_level;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  byte bVar7;
  byte bVar8;
  uint i;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  byte bVar12;
  int iVar13;
  anon_union_32_2_267bb92b_for_symbolic_compressed_block_9 *paVar14;
  byte bVar15;
  byte bVar16;
  uint i_2;
  ulong uVar17;
  ulong uVar18;
  uint i_3;
  long lVar19;
  uint uVar20;
  long lVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  uint8_t weightbuf [16];
  uint8_t values_to_encode [32];
  uint8_t weights [64];
  undefined8 local_a8;
  undefined8 uStack_a0;
  uint8_t local_98 [32];
  uint8_t local_78 [72];
  
  uVar1 = scb->block_type;
  if (uVar1 == '\x01') {
    pcb[0] = 0xfc;
    pcb[1] = 0xff;
    pcb[2] = 0xff;
    pcb[3] = 0xff;
    pcb[4] = 0xff;
    pcb[5] = 0xff;
    pcb[6] = 0xff;
    pcb[7] = 0xff;
    lVar21 = 0;
    do {
      pcb[lVar21 * 2 + 8] = scb->color_formats[lVar21 * 4 + 0xc];
      pcb[lVar21 * 2 + 9] = scb->color_formats[lVar21 * 4 + 0xd];
      lVar21 = lVar21 + 1;
    } while (lVar21 != 4);
  }
  else if (uVar1 == '\x02') {
    pcb[0] = 0xfc;
    pcb[1] = 0xfd;
    pcb[2] = 0xff;
    pcb[3] = 0xff;
    pcb[4] = 0xff;
    pcb[5] = 0xff;
    pcb[6] = 0xff;
    pcb[7] = 0xff;
    lVar21 = 0;
    do {
      pcb[lVar21 * 2 + 8] = scb->color_formats[lVar21 * 4 + 0xc];
      pcb[lVar21 * 2 + 9] = scb->color_formats[lVar21 * 4 + 0xd];
      lVar21 = lVar21 + 1;
    } while (lVar21 != 4);
  }
  else {
    if (uVar1 == '\0') {
      __assert_fail("scb.block_type != SYM_BTYPE_ERROR",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_symbolic_physical.cpp"
                    ,0x6b,
                    "void symbolic_to_physical(const block_size_descriptor &, const symbolic_compressed_block &, uint8_t *)"
                   );
    }
    bVar8 = scb->partition_count;
    uVar18 = (ulong)bVar8;
    local_a8 = 0;
    uStack_a0 = 0;
    uVar3 = bsd->block_mode_packed_index[scb->block_mode];
    if ((uVar3 == 0xffff) ||
       (bsd->block_mode_count_all < (uint)uVar3 || bsd->block_mode_count_all == (uint)uVar3)) {
      __assert_fail("packed_index != BLOCK_BAD_BLOCK_MODE && packed_index < this->block_mode_count_all"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_internal.h"
                    ,0x27f,
                    "const block_mode &block_size_descriptor::get_block_mode(unsigned int) const");
    }
    bVar2 = bsd->decimation_tables[bsd->block_modes[uVar3].decimation_mode].weight_count;
    uVar17 = (ulong)bVar2;
    bVar12 = bsd->block_modes[uVar3].quant_mode;
    if (bVar12 < 0x15) {
      fVar22 = *(float *)(&DAT_00330774 + (ulong)(uint)bVar12 * 4);
    }
    else {
      fVar22 = -1.0;
    }
    bVar16 = bsd->block_modes[uVar3].field_0x5;
    bVar15 = bVar16 & 1;
    lVar21 = (ulong)bVar12 * 0xe2;
    uVar20 = (uint)bVar2 << (bVar16 & 1);
    uVar9 = get_ise_sequence_bitcount(uVar20,(uint)bVar12);
    if (bVar15 == 0) {
      if (uVar17 != 0) {
        uVar17 = 0;
        do {
          local_78[uVar17] =
               *(uint8_t *)
                (lVar21 + 0x330c70 +
                (long)(int)(fVar22 * (float)scb->weights[uVar17] * 0.015625 + 0.5));
          uVar17 = uVar17 + 1;
        } while ((uint)bVar2 != uVar17);
      }
    }
    else if (uVar17 != 0) {
      uVar11 = 0;
      do {
        local_78[uVar11 * 2] =
             *(uint8_t *)
              (lVar21 + 0x330c70 +
              (long)(int)(fVar22 * (float)scb->weights[uVar11] * 0.015625 + 0.5));
        local_78[uVar11 * 2 + 1] =
             *(uint8_t *)
              (lVar21 + 0x330c70 +
              (long)(int)(fVar22 * (float)scb->weights[uVar11 + 0x20] * 0.015625 + 0.5));
        uVar11 = uVar11 + 1;
      } while (uVar17 != uVar11);
    }
    encode_ise((uint)bVar12,uVar20,local_78,(uint8_t *)&local_a8,0);
    auVar23._8_8_ = uStack_a0;
    auVar23._0_8_ = local_a8;
    auVar5 = vpshufb_avx(auVar23,_DAT_00330710);
    auVar24[8] = 0xf;
    auVar24._0_8_ = 0xf0f0f0f0f0f0f0f;
    auVar24[9] = 0xf;
    auVar24[10] = 0xf;
    auVar24[0xb] = 0xf;
    auVar24[0xc] = 0xf;
    auVar24[0xd] = 0xf;
    auVar24[0xe] = 0xf;
    auVar24[0xf] = 0xf;
    auVar23 = vpand_avx(auVar5,auVar24);
    auVar6 = vpshufb_avx(_DAT_00330720,auVar23);
    auVar23 = vpsrlw_avx(auVar5,4);
    auVar23 = vpand_avx(auVar23,auVar24);
    auVar23 = vpshufb_avx((undefined1  [16])basist::pack_astc_block::s_reverse_bits4,auVar23);
    auVar23 = vpor_avx(auVar6,auVar23);
    *(undefined1 (*) [16])pcb = auVar23;
    uVar4 = scb->block_mode;
    *pcb = (uint8_t)uVar4;
    bVar2 = pcb[2];
    bVar12 = (byte)(uVar4 >> 8) & 7;
    bVar16 = bVar8 * '\b' + 0x18 & 0x18;
    pcb[1] = pcb[1] & 0xe0 | bVar16 | bVar12;
    iVar10 = 0x80 - uVar9;
    if (bVar8 < 2) {
      bVar8 = scb->color_formats[0];
      pcb[1] = bVar8 << 5 | bVar16 | bVar12;
      pcb[2] = bVar8 >> 3 & 1 | bVar2 & 0xfe;
    }
    else {
      bVar7 = (byte)scb->partition_index;
      pcb[1] = bVar16 | bVar7 << 5 | bVar12;
      bVar12 = bVar7 >> 3 & 7;
      pcb[2] = bVar2 & 0xf8 | bVar12;
      bVar16 = (byte)(scb->partition_index >> 3) & 0x78;
      pcb[2] = bVar2 & 0x80 | bVar12 | bVar16;
      if (scb->color_formats_matched == '\0') {
        uVar9 = 4;
        uVar17 = 0;
        do {
          uVar20 = (uint)(scb->color_formats[uVar17] >> 2);
          if (uVar9 <= uVar20) {
            uVar20 = uVar9;
          }
          uVar9 = uVar20;
          uVar17 = uVar17 + 1;
        } while (uVar18 != uVar17);
        uVar20 = 2;
        if (uVar9 != 3) {
          uVar20 = uVar9;
        }
        uVar9 = uVar20 + 1;
        uVar17 = 0;
        do {
          uVar9 = uVar9 | (scb->color_formats[uVar17] >> 2) - uVar20 << ((char)uVar17 + 2U & 0x1f);
          uVar17 = uVar17 + 1;
        } while (uVar18 != uVar17);
        uVar17 = 0;
        uVar20 = (uint)bVar8;
        do {
          uVar20 = uVar20 + 2;
          uVar9 = uVar9 | (scb->color_formats[uVar17] & 3) << ((byte)uVar20 & 0x1f);
          uVar17 = uVar17 + 1;
        } while (uVar17 != uVar18);
        iVar13 = (uint)bVar8 * 3 + -4;
        iVar10 = iVar10 - iVar13;
        pcb[2] = bVar12 | (byte)(uVar9 << 7) | bVar16;
        pcb[3] = (byte)uVar9 >> 1 & 0x1f | pcb[3] & 0xe0;
        uVar20 = ~(-1 << ((byte)iVar13 & 0x1f));
        lVar21 = (long)(iVar10 >> 3);
        bVar8 = (byte)iVar10 & 7;
        iVar13 = ((int)uVar9 >> 6 & uVar20) << bVar8;
        uVar9 = ~(uVar20 << bVar8);
        pcb[lVar21] = (byte)iVar13 | pcb[lVar21] & (byte)uVar9;
        pcb[lVar21 + 1] = (byte)((uint)iVar13 >> 8) | (byte)(uVar9 >> 8) & pcb[lVar21 + 1];
      }
      else {
        uVar1 = scb->color_formats[0];
        pcb[2] = bVar16 | bVar12;
        pcb[3] = pcb[3] & 0xe0 | uVar1 * '\x02' & 0x1e;
      }
    }
    if (bVar15 != 0) {
      bVar8 = (byte)(iVar10 + -2) & 7;
      iVar13 = ((byte)scb->plane2_component & 3) << bVar8;
      lVar21 = (long)(iVar10 + -2 >> 3);
      uVar9 = ~(3 << bVar8);
      pcb[lVar21] = (byte)iVar13 | pcb[lVar21] & (byte)uVar9;
      pcb[lVar21 + 1] = (byte)((uint)iVar13 >> 8) | (byte)(uVar9 >> 8) & pcb[lVar21 + 1];
    }
    quant_level = scb->quant_mode;
    bVar8 = scb->partition_count;
    if ((ulong)bVar8 == 0) {
      uVar9 = 0;
    }
    else {
      paVar14 = &scb->field_9;
      uVar18 = 0;
      uVar9 = 0;
      do {
        uVar20 = scb->color_formats[uVar18] >> 1 & 0xfffffffe;
        if (6 < (byte)uVar20) {
          __assert_fail("vals <= 8",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_symbolic_physical.cpp"
                        ,0x114,
                        "void symbolic_to_physical(const block_size_descriptor &, const symbolic_compressed_block &, uint8_t *)"
                       );
        }
        lVar21 = (ulong)uVar20 + 2;
        lVar19 = 0;
        do {
          local_98[lVar19 + (ulong)uVar9] =
               *(uint8_t *)
                ((long)(int)quant_level * 0x100 + 0x336170 +
                (ulong)*(byte *)((long)paVar14 + lVar19));
          lVar19 = lVar19 + 1;
        } while (lVar21 != lVar19);
        uVar9 = uVar9 + (int)lVar21;
        uVar18 = uVar18 + 1;
        paVar14 = (anon_union_32_2_267bb92b_for_symbolic_compressed_block_9 *)((long)paVar14 + 8);
      } while (uVar18 != bVar8);
    }
    uVar20 = 0x1d;
    if (bVar8 == 1) {
      uVar20 = 0x11;
    }
    encode_ise(quant_level,uVar9,local_98,pcb,uVar20);
  }
  return;
}

Assistant:

void symbolic_to_physical(
	const block_size_descriptor& bsd,
	const symbolic_compressed_block& scb,
	uint8_t pcb[16]
) {
	assert(scb.block_type != SYM_BTYPE_ERROR);

	// Constant color block using UNORM16 colors
	if (scb.block_type == SYM_BTYPE_CONST_U16)
	{
		// There is currently no attempt to coalesce larger void-extents
		static const uint8_t cbytes[8] { 0xFC, 0xFD, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF };
		for (unsigned int i = 0; i < 8; i++)
		{
			pcb[i] = cbytes[i];
		}

		for (unsigned int i = 0; i < BLOCK_MAX_COMPONENTS; i++)
		{
			pcb[2 * i + 8] = scb.constant_color[i] & 0xFF;
			pcb[2 * i + 9] = (scb.constant_color[i] >> 8) & 0xFF;
		}

		return;
	}

	// Constant color block using FP16 colors
	if (scb.block_type == SYM_BTYPE_CONST_F16)
	{
		// There is currently no attempt to coalesce larger void-extents
		static const uint8_t cbytes[8]  { 0xFC, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF };
		for (unsigned int i = 0; i < 8; i++)
		{
			pcb[i] = cbytes[i];
		}

		for (unsigned int i = 0; i < BLOCK_MAX_COMPONENTS; i++)
		{
			pcb[2 * i + 8] = scb.constant_color[i] & 0xFF;
			pcb[2 * i + 9] = (scb.constant_color[i] >> 8) & 0xFF;
		}

		return;
	}

	unsigned int partition_count = scb.partition_count;

	// Compress the weights.
	// They are encoded as an ordinary integer-sequence, then bit-reversed
	uint8_t weightbuf[16] { 0 };

	const auto& bm = bsd.get_block_mode(scb.block_mode);
	const auto& di = bsd.get_decimation_info(bm.decimation_mode);
	int weight_count = di.weight_count;
	quant_method weight_quant_method = bm.get_weight_quant_mode();
	float weight_quant_levels = static_cast<float>(get_quant_level(weight_quant_method));
	int is_dual_plane = bm.is_dual_plane;

	const auto& qat = quant_and_xfer_tables[weight_quant_method];

	int real_weight_count = is_dual_plane ? 2 * weight_count : weight_count;

	int bits_for_weights = get_ise_sequence_bitcount(real_weight_count, weight_quant_method);

	uint8_t weights[64];
	if (is_dual_plane)
	{
		for (int i = 0; i < weight_count; i++)
		{
			float uqw = static_cast<float>(scb.weights[i]);
			float qw = (uqw / 64.0f) * (weight_quant_levels - 1.0f);
			int qwi = static_cast<int>(qw + 0.5f);
			weights[2 * i] = qat.scramble_map[qwi];

			uqw = static_cast<float>(scb.weights[i + WEIGHTS_PLANE2_OFFSET]);
			qw = (uqw / 64.0f) * (weight_quant_levels - 1.0f);
			qwi = static_cast<int>(qw + 0.5f);
			weights[2 * i + 1] = qat.scramble_map[qwi];
		}
	}
	else
	{
		for (int i = 0; i < weight_count; i++)
		{
			float uqw = static_cast<float>(scb.weights[i]);
			float qw = (uqw / 64.0f) * (weight_quant_levels - 1.0f);
			int qwi = static_cast<int>(qw + 0.5f);
			weights[i] = qat.scramble_map[qwi];
		}
	}

	encode_ise(weight_quant_method, real_weight_count, weights, weightbuf, 0);

	for (int i = 0; i < 16; i++)
	{
		pcb[i] = static_cast<uint8_t>(bitrev8(weightbuf[15 - i]));
	}

	write_bits(scb.block_mode, 11, 0, pcb);
	write_bits(partition_count - 1, 2, 11, pcb);

	int below_weights_pos = 128 - bits_for_weights;

	// Encode partition index and color endpoint types for blocks with 2+ partitions
	if (partition_count > 1)
	{
		write_bits(scb.partition_index, 6, 13, pcb);
		write_bits(scb.partition_index >> 6, PARTITION_INDEX_BITS - 6, 19, pcb);

		if (scb.color_formats_matched)
		{
			write_bits(scb.color_formats[0] << 2, 6, 13 + PARTITION_INDEX_BITS, pcb);
		}
		else
		{
			// Check endpoint types for each partition to determine the lowest class present
			int low_class = 4;

			for (unsigned int i = 0; i < partition_count; i++)
			{
				int class_of_format = scb.color_formats[i] >> 2;
				low_class = astc::min(class_of_format, low_class);
			}

			if (low_class == 3)
			{
				low_class = 2;
			}

			int encoded_type = low_class + 1;
			int bitpos = 2;

			for (unsigned int i = 0; i < partition_count; i++)
			{
				int classbit_of_format = (scb.color_formats[i] >> 2) - low_class;
				encoded_type |= classbit_of_format << bitpos;
				bitpos++;
			}

			for (unsigned int i = 0; i < partition_count; i++)
			{
				int lowbits_of_format = scb.color_formats[i] & 3;
				encoded_type |= lowbits_of_format << bitpos;
				bitpos += 2;
			}

			int encoded_type_lowpart = encoded_type & 0x3F;
			int encoded_type_highpart = encoded_type >> 6;
			int encoded_type_highpart_size = (3 * partition_count) - 4;
			int encoded_type_highpart_pos = 128 - bits_for_weights - encoded_type_highpart_size;
			write_bits(encoded_type_lowpart, 6, 13 + PARTITION_INDEX_BITS, pcb);
			write_bits(encoded_type_highpart, encoded_type_highpart_size, encoded_type_highpart_pos, pcb);
			below_weights_pos -= encoded_type_highpart_size;
		}
	}
	else
	{
		write_bits(scb.color_formats[0], 4, 13, pcb);
	}

	// In dual-plane mode, encode the color component of the second plane of weights
	if (is_dual_plane)
	{
		write_bits(scb.plane2_component, 2, below_weights_pos - 2, pcb);
	}

	// Encode the color components
	uint8_t values_to_encode[32];
	int valuecount_to_encode = 0;

	const uint8_t* pack_table = color_uquant_to_scrambled_pquant_tables[scb.quant_mode - QUANT_6];
	for (unsigned int i = 0; i < scb.partition_count; i++)
	{
		int vals = 2 * (scb.color_formats[i] >> 2) + 2;
		assert(vals <= 8);
		for (int j = 0; j < vals; j++)
		{
			values_to_encode[j + valuecount_to_encode] = pack_table[scb.color_values[i][j]];
		}
		valuecount_to_encode += vals;
	}

	encode_ise(scb.get_color_quant_mode(), valuecount_to_encode, values_to_encode, pcb,
	           scb.partition_count == 1 ? 17 : 19 + PARTITION_INDEX_BITS);
}